

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  ulong uVar5;
  ctrl_t *pcVar6;
  pointer pcVar7;
  ulong *puVar8;
  size_type sVar9;
  undefined1 auVar10 [16];
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  undefined8 uVar26;
  ctrl_t *pcVar27;
  size_t sVar28;
  slot_type *psVar29;
  slot_type *psVar30;
  ulong uVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  ulong uVar33;
  byte bVar34;
  size_t i;
  FindInfo FVar35;
  type raw;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_51;
  ulong *local_50;
  undefined8 local_48;
  ulong local_40;
  undefined8 uStack_38;
  
  uVar5 = this->capacity_;
  if ((uVar5 == 0) || ((uVar5 + 1 & uVar5) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::basic_string<char>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::basic_string<char>>]"
                 );
  }
  if (uVar5 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f9,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::basic_string<char>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::basic_string<char>>]"
                 );
  }
  pcVar6 = this->ctrl_;
  if (pcVar6[uVar5] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar27 = pcVar6 + uVar5;
  if (pcVar27 + 1 != pcVar6) {
    uVar33 = 0;
    do {
      pcVar1 = pcVar6 + uVar33;
      cVar11 = pcVar1[1];
      cVar12 = pcVar1[2];
      cVar13 = pcVar1[3];
      cVar14 = pcVar1[4];
      cVar15 = pcVar1[5];
      cVar16 = pcVar1[6];
      cVar17 = pcVar1[7];
      cVar18 = pcVar1[8];
      cVar19 = pcVar1[9];
      cVar20 = pcVar1[10];
      cVar21 = pcVar1[0xb];
      cVar22 = pcVar1[0xc];
      cVar23 = pcVar1[0xd];
      cVar24 = pcVar1[0xe];
      cVar25 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar6 + uVar33);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar23 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar24 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar25 < '\0') & 0x7eU ^ 0xfe;
      uVar33 = uVar33 + 0x10;
    } while (uVar5 + 1 != uVar33);
  }
  uVar26 = *(undefined8 *)(pcVar6 + 8);
  *(undefined8 *)(pcVar27 + 1) = *(undefined8 *)pcVar6;
  *(undefined8 *)(pcVar27 + 9) = uVar26;
  *pcVar27 = -1;
  sVar28 = this->capacity_;
  if (sVar28 != 0) {
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        sVar28 = std::
                 hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator()(&local_51,this->slots_ + i);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = sVar28;
        uVar33 = SUB168(auVar10 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar10 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar35 = find_first_non_full(this,uVar33);
        sVar28 = FVar35.offset;
        uVar5 = this->capacity_;
        if ((uVar5 + 1 & uVar5) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar31 = uVar33 >> 7 & uVar5;
        bVar34 = (byte)uVar33;
        if (((i - uVar31 ^ sVar28 - uVar31) & uVar5) < 0x10) {
          bVar34 = bVar34 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar28] == -2) {
            set_ctrl(this,sVar28,bVar34 & 0x7f);
            local_50 = &local_40;
            psVar30 = this->slots_ + i;
            paVar32 = &psVar30->field_2;
            puVar8 = (ulong *)(psVar30->_M_dataplus)._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8 == paVar32) {
              local_40 = paVar32->_M_allocated_capacity;
              uStack_38 = *(undefined8 *)((long)&psVar30->field_2 + 8);
            }
            else {
              local_40 = paVar32->_M_allocated_capacity;
              local_50 = puVar8;
            }
            psVar30 = this->slots_ + i;
            sVar9 = psVar30->_M_string_length;
            (psVar30->_M_dataplus)._M_p = (pointer)paVar32;
            psVar30->_M_string_length = 0;
            (psVar30->field_2)._M_local_buf[0] = '\0';
            psVar29 = this->slots_;
            psVar30 = psVar29 + i;
            psVar3 = psVar29 + i;
            (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
            psVar4 = psVar29 + sVar28;
            paVar32 = &psVar4->field_2;
            pcVar7 = (psVar4->_M_dataplus)._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar7 == paVar32) {
              uVar26 = *(undefined8 *)((long)&psVar4->field_2 + 8);
              (psVar3->field_2)._M_allocated_capacity = paVar32->_M_allocated_capacity;
              *(undefined8 *)((long)&psVar3->field_2 + 8) = uVar26;
            }
            else {
              (psVar30->_M_dataplus)._M_p = pcVar7;
              (psVar30->field_2)._M_allocated_capacity = paVar32->_M_allocated_capacity;
            }
            psVar29 = psVar29 + sVar28;
            psVar30->_M_string_length = psVar29->_M_string_length;
            (psVar29->_M_dataplus)._M_p = (pointer)paVar32;
            psVar29->_M_string_length = 0;
            (psVar29->field_2)._M_local_buf[0] = '\0';
            psVar30 = this->slots_ + sVar28;
            paVar32 = &this->slots_[sVar28].field_2;
            (((slot_type *)(paVar32 + -1))->_M_dataplus)._M_p = (pointer)paVar32;
            if (local_50 == &local_40) {
              paVar32->_M_allocated_capacity = local_40;
              *(undefined8 *)((long)paVar32 + 8) = uStack_38;
            }
            else {
              (psVar30->_M_dataplus)._M_p = (pointer)local_50;
              (psVar30->field_2)._M_allocated_capacity = local_40;
            }
            psVar30->_M_string_length = sVar9;
            local_48 = 0;
            local_40 = local_40 & 0xffffffffffffff00;
            i = i - 1;
            local_50 = &local_40;
            goto LAB_0012c3fa;
          }
          if (this->ctrl_[sVar28] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                          ,0x92b,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::basic_string<char>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::basic_string<char>>]"
                         );
          }
          set_ctrl(this,sVar28,bVar34 & 0x7f);
          psVar29 = this->slots_;
          psVar30 = psVar29 + sVar28;
          psVar3 = psVar29 + sVar28;
          (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
          psVar4 = psVar29 + i;
          paVar32 = &psVar4->field_2;
          pcVar7 = (psVar4->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar7 == paVar32) {
            uVar26 = *(undefined8 *)((long)&psVar4->field_2 + 8);
            (psVar3->field_2)._M_allocated_capacity = paVar32->_M_allocated_capacity;
            *(undefined8 *)((long)&psVar3->field_2 + 8) = uVar26;
          }
          else {
            (psVar30->_M_dataplus)._M_p = pcVar7;
            (psVar30->field_2)._M_allocated_capacity = paVar32->_M_allocated_capacity;
          }
          psVar29 = psVar29 + i;
          psVar30->_M_string_length = psVar29->_M_string_length;
          (psVar29->_M_dataplus)._M_p = (pointer)paVar32;
          psVar29->_M_string_length = 0;
          (psVar29->field_2)._M_local_buf[0] = '\0';
          bVar34 = 0x80;
        }
        set_ctrl(this,i,bVar34);
      }
LAB_0012c3fa:
      i = i + 1;
      sVar28 = this->capacity_;
    } while (i != sVar28);
  }
  reset_growth_left(this,sVar28);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
				assert(IsValidCapacity(capacity_));
				assert(!is_small());
				// Algorithm:
				// - mark all DELETED slots as EMPTY
				// - mark all FULL slots as DELETED
				// - for each slot marked as DELETED
				//     hash = Hash(element)
				//     target = find_first_non_full(hash)
				//     if target is in the same group
				//       mark slot as FULL
				//     else if target is EMPTY
				//       transfer element to target
				//       mark slot as EMPTY
				//       mark target as FULL
				//     else if target is DELETED
				//       swap current element with target element
				//       mark target as FULL
				//       repeat procedure for current slot with moved from element (target)
				ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
				typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
				raw;
				slot_type* slot = reinterpret_cast<slot_type*>(&raw);
				for (size_t i = 0; i != capacity_; ++i)
				{
					if (!IsDeleted(ctrl_[i])) continue;
					size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
					PolicyTraits::element(slots_ + i));
					auto target = find_first_non_full(hashval);
					size_t new_i = target.offset;

					// Verify if the old and new i fall within the same group wrt the hashval.
					// If they do, we don't need to move the object as it falls already in the
					// best probe we can.
					const auto probe_index = [&](size_t pos) {
						return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
					};

					// Element doesn't move.
					if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
						set_ctrl(i, H2(hashval));
						continue;
					}
					if (IsEmpty(ctrl_[new_i])) {
						// Transfer element to the empty spot.
						// set_ctrl poisons/unpoisons the slots so we have to call it at the
						// right time.
						set_ctrl(new_i, H2(hashval));
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
						set_ctrl(i, kEmpty);
					}
					else {
						assert(IsDeleted(ctrl_[new_i]));
						set_ctrl(new_i, H2(hashval));
						// Until we are done rehashing, DELETED marks previously FULL slots.
						// Swap i and new_i elements.
						PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
						--i;  // repeat
					}
				}
				reset_growth_left(capacity_);
			}